

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_infinity(secp256k1_ge *r)

{
  secp256k1_fe *in_RDI;
  
  *(undefined4 *)in_RDI[2].n = 1;
  secp256k1_fe_impl_clear(in_RDI);
  secp256k1_fe_impl_clear(in_RDI + 1);
  secp256k1_ge_verify((secp256k1_ge *)0x10c279f);
  return;
}

Assistant:

static void secp256k1_ge_set_infinity(secp256k1_ge *r) {
    r->infinity = 1;
    secp256k1_fe_clear(&r->x);
    secp256k1_fe_clear(&r->y);

    SECP256K1_GE_VERIFY(r);
}